

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

size_t __thiscall
UdpSocket::Implementation::ReceiveFrom
          (Implementation *this,IpEndpointName *remoteEndpoint,char *data,size_t size)

{
  size_t sVar1;
  size_t sVar2;
  socklen_t fromAddrLen;
  sockaddr_in fromAddr;
  socklen_t local_24;
  sockaddr local_20;
  
  if (this->isBound_ != false) {
    local_24 = 0x10;
    sVar1 = recvfrom(this->socket_,data,size,0,&local_20,&local_24);
    sVar2 = 0;
    if (-1 < (long)sVar1) {
      remoteEndpoint->address =
           (ulong)((uint)local_20.sa_data._2_4_ >> 0x18 | (local_20.sa_data._2_4_ & 0xff0000) >> 8 |
                   (local_20.sa_data._2_4_ & 0xff00) << 8 | local_20.sa_data._2_4_ << 0x18);
      remoteEndpoint->port =
           (uint)(ushort)(local_20.sa_data._0_2_ << 8 | (ushort)local_20.sa_data._0_2_ >> 8);
      sVar2 = sVar1;
    }
    return sVar2;
  }
  __assert_fail("isBound_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TheTechnobear[P]OscProxy/oscpack/ip/posix/UdpSocket.cpp"
                ,0xe9,
                "std::size_t UdpSocket::Implementation::ReceiveFrom(IpEndpointName &, char *, std::size_t)"
               );
}

Assistant:

std::size_t ReceiveFrom( IpEndpointName& remoteEndpoint, char *data, std::size_t size )
	{
		assert( isBound_ );

		struct sockaddr_in fromAddr;
        socklen_t fromAddrLen = sizeof(fromAddr);
             	 
        ssize_t result = recvfrom(socket_, data, size, 0,
                    (struct sockaddr *) &fromAddr, (socklen_t*)&fromAddrLen);
		if( result < 0 )
			return 0;

		remoteEndpoint.address = ntohl(fromAddr.sin_addr.s_addr);
		remoteEndpoint.port = ntohs(fromAddr.sin_port);

		return (std::size_t)result;
	}